

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

void __thiscall QFontCache::increaseCost(QFontCache *this,uint cost)

{
  uint uVar1;
  
  uVar1 = 1;
  if (0x3ff < cost + 0x200) {
    uVar1 = cost + 0x200 >> 10;
  }
  uVar1 = uVar1 + this->total_cost;
  this->total_cost = uVar1;
  if (((this->max_cost < uVar1) && (this->max_cost = uVar1, this->autoClean == true)) &&
     (((this->timer).m_id == Invalid || (this->fast == false)))) {
    QBasicTimer::start(&this->timer,(Duration)0x2540be400,&this->super_QObject);
    this->fast = true;
  }
  return;
}

Assistant:

void QFontCache::increaseCost(uint cost)
{
    cost = (cost + 512) / 1024; // store cost in kb
    cost = cost > 0 ? cost : 1;
    total_cost += cost;

    FC_DEBUG("  COST: increased %u kb, total_cost %u kb, max_cost %u kb",
            cost, total_cost, max_cost);

    if (total_cost > max_cost) {
        max_cost = total_cost;

        if (!autoClean)
            return;

        if (!timer.isActive() || ! fast) {
            FC_DEBUG("  TIMER: starting fast timer (%d s)", static_cast<int>(fast_timeout.count()));

            timer.start(fast_timeout, this);
            fast = true;
        }
    }
}